

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_wrapper_u(uchar *script,size_t script_len,size_t *write_len)

{
  size_t __n;
  size_t used_len;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  
  __n = *write_len;
  if (((__n == 0) || (script_len < __n + 4)) || (10000 < __n + 4)) {
    script_local._4_4_ = -2;
  }
  else {
    memmove(script + 1,script,__n);
    *script = 'c';
    script[__n + 1] = 'g';
    script[__n + 2] = '\0';
    script[__n + 3] = 'h';
    *write_len = __n + 4;
    script_local._4_4_ = 0;
  }
  return script_local._4_4_;
}

Assistant:

static int generate_by_wrapper_u(
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    size_t used_len = *write_len;
    if (!used_len || (used_len + 4 > script_len) || (used_len + 4 > DESCRIPTOR_WITNESS_SCRIPT_MAX_SIZE))
        return WALLY_EINVAL;

    memmove(script + 1, script, used_len);
    script[0] = OP_IF;
    script[used_len + 1] = OP_ELSE;
    script[used_len + 2] = OP_0;
    script[used_len + 3] = OP_ENDIF;
    *write_len = used_len + 4;
    return WALLY_OK;
}